

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

uchar * stbi__jpeg_load(stbi__context *s,int *x,int *y,int *comp,int req_comp)

{
  stbi__jpeg *j_00;
  stbi_uc *psVar1;
  stbi__jpeg *j;
  uchar *result;
  int req_comp_local;
  int *comp_local;
  int *y_local;
  int *x_local;
  stbi__context *s_local;
  
  j_00 = (stbi__jpeg *)stbi__malloc(0x4780);
  j_00->s = s;
  stbi__setup_jpeg(j_00);
  psVar1 = load_jpeg_image(j_00,x,y,comp,req_comp);
  free(j_00);
  return psVar1;
}

Assistant:

static unsigned char *stbi__jpeg_load(stbi__context *s, int *x, int *y, int *comp, int req_comp)
{
   unsigned char* result;
   stbi__jpeg* j = (stbi__jpeg*) stbi__malloc(sizeof(stbi__jpeg));
   j->s = s;
   stbi__setup_jpeg(j);
   result = load_jpeg_image(j, x,y,comp,req_comp);
   STBI_FREE(j);
   return result;
}